

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

TPZGeoElSide * __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>::Father2
          (TPZGeoElSide *__return_storage_ptr__,
          TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_> *this,int side)

{
  int iVar1;
  int iVar2;
  TPZGeoEl *pTVar3;
  
  pTVar3 = TPZGeoEl::Father(&this->super_TPZGeoEl);
  iVar2 = -1;
  if (pTVar3 != (TPZGeoEl *)0x0) {
    iVar1 = TPZGeoEl::WhichSubel(&this->super_TPZGeoEl);
    if (-1 < iVar1) {
      iVar2 = (**(code **)(*(long *)pTVar3 + 0x250))(pTVar3,side,iVar1);
      goto LAB_00f74a0e;
    }
  }
  pTVar3 = (TPZGeoEl *)0x0;
LAB_00f74a0e:
  (__return_storage_ptr__->super_TPZSavable)._vptr_TPZSavable =
       (_func_int **)&PTR__TPZGeoElSide_01920090;
  __return_storage_ptr__->fGeoEl = pTVar3;
  __return_storage_ptr__->fSide = iVar2;
  return __return_storage_ptr__;
}

Assistant:

TPZGeoElSide
TPZGeoElRefLess<TGeo>::Father2(int side) const
{
	//std::cout << " Father2 teste Cedric: 08/05/2003\n";
	TPZGeoEl *father = Father();
	if(!father) return TPZGeoElSide();
	int son = WhichSubel();
	if(son<0) return TPZGeoElSide();
	int fathsid = father->FatherSide(side,son);
	return TPZGeoElSide(father,fathsid);
}